

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseCpdRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  anon_struct_4_3_7b74da23_for_Offset aVar1;
  pointer pcVar2;
  TreeModel *pTVar3;
  undefined8 uVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  UINT8 UVar8;
  UINT32 offset;
  uint uVar9;
  int iVar10;
  uint pos;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  size_t __n;
  uint uVar14;
  USTATUS UVar15;
  pointer pCVar16;
  uint uVar17;
  ulong uVar18;
  pointer __dest;
  ulong uVar19;
  long lVar20;
  _Alloc_hider _Var21;
  vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> partitions;
  UByteArray entry;
  anon_struct_4_3_7b74da23_for_Offset local_1d0;
  UByteArray header_1;
  UModelIndex entryIndex;
  CPD_PARTITION_INFO partition;
  _func_int **local_128;
  uint64_t local_120;
  undefined1 local_118 [16];
  CBString info;
  CBString name;
  UModelIndex partitionIndex;
  CBString local_b8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  UByteArray body;
  UByteArray header;
  
  uVar9 = (uint)(region->d)._M_string_length;
  if (uVar9 < 0x10) {
    usprintf((CBString *)&partition,"%s: CPD too small to fit rev1 partition table header",
             "parseCpdRegion");
    msg(this,(CBString *)&partition,parent);
  }
  else {
    pcVar2 = (region->d)._M_dataplus._M_p;
    if (pcVar2[8] == '\x01') {
      offset = 0x10;
    }
    else {
      offset = 0;
      if (pcVar2[8] == '\x02') {
        if (uVar9 < 0x14) {
          usprintf((CBString *)&partition,"%s: CPD too small to fit rev2 partition table header",
                   "parseCpdRegion");
          msg(this,(CBString *)&partition,parent);
          goto LAB_00131b8a;
        }
        offset = 0x14;
      }
    }
    iVar10 = *(int *)(pcVar2 + 4);
    pos = iVar10 * 0x18 + offset;
    if (pos <= uVar9) {
      UByteArray::left(&header,region,offset);
      UByteArray::mid(&body,region,offset,iVar10 * 0x18);
      usprintf(&name,"CPD partition table");
      usprintf(&info,
               "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nHeader version: %u\nEntry version: %u"
               ,(ulong)pos,pos,(ulong)(uint)header.d._M_string_length,
               (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
               (ulong)(uint)body.d._M_string_length,(ulong)*(uint *)(pcVar2 + 4),
               (ulong)(byte)pcVar2[8],(ulong)(byte)pcVar2[9]);
      pTVar3 = this->model;
      Bstrlib::CBString::CBString((CBString *)&header_1);
      partition.ptEntry.EntryName._0_8_ = &partition.ptEntry.Length;
      partition.ptEntry.EntryName[8] = '\0';
      partition.ptEntry.EntryName[9] = '\0';
      partition.ptEntry.EntryName[10] = '\0';
      partition.ptEntry.EntryName[0xb] = '\0';
      partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
      partition.ptEntry.Length._0_1_ = 0;
      TreeModel::addItem((UModelIndex *)&entry,pTVar3,localOffset,'_','\0',&name,
                         (CBString *)&header_1,&info,&header,&body,(UByteArray *)&partition,Fixed,
                         parent,'\0');
      index->m = (TreeModel *)
                 CONCAT71(entry.d.field_2._M_allocated_capacity._1_7_,
                          entry.d.field_2._M_local_buf[0]);
      *(pointer *)index = entry.d._M_dataplus._M_p;
      index->i = entry.d._M_string_length;
      std::__cxx11::string::~string((string *)&partition);
      Bstrlib::CBString::~CBString((CBString *)&header_1);
      partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Var21 = body.d._M_dataplus;
      for (uVar19 = 0; uVar19 < *(uint *)(pcVar2 + 4); uVar19 = uVar19 + 1) {
        UByteArray::UByteArray(&entry,_Var21._M_p,0x18);
        usprintf((CBString *)&partition,"%.12s",_Var21._M_p);
        Bstrlib::CBString::operator=(&name,(CBString *)&partition);
        Bstrlib::CBString::~CBString((CBString *)&partition);
        usprintf((CBString *)&header_1,
                 "Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
                 entry.d._M_string_length & 0xffffffff,entry.d._M_string_length & 0xffffffff,
                 (ulong)(*(uint *)((UINT8 *)_Var21._M_p + 0xc) & 0x1ffffff),
                 (ulong)*(uint *)((UINT8 *)_Var21._M_p + 0x10));
        pcVar13 = "Yes";
        if ((*(uint *)((UINT8 *)_Var21._M_p + 0xc) >> 0x19 & 1) == 0) {
          pcVar13 = "No";
        }
        Bstrlib::CBString::operator+((CBString *)&partition,(CBString *)&header_1,pcVar13);
        Bstrlib::CBString::operator=(&info,(CBString *)&partition);
        Bstrlib::CBString::~CBString((CBString *)&partition);
        Bstrlib::CBString::~CBString((CBString *)&header_1);
        pTVar3 = this->model;
        Bstrlib::CBString::CBString((CBString *)&local_128);
        partition.ptEntry.EntryName._0_8_ = &partition.ptEntry.Length;
        partition.ptEntry.EntryName[8] = '\0';
        partition.ptEntry.EntryName[9] = '\0';
        partition.ptEntry.EntryName[10] = '\0';
        partition.ptEntry.EntryName[0xb] = '\0';
        partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
        partition.ptEntry.Length._0_1_ = 0;
        header_1.d._M_dataplus._M_p = (pointer)&header_1.d.field_2;
        header_1.d._M_string_length = 0;
        header_1.d.field_2._M_local_buf[0] = '\0';
        TreeModel::addItem(&entryIndex,pTVar3,offset,'`','\0',&name,(CBString *)&local_128,&info,
                           (UByteArray *)&partition,&entry,&header_1,Fixed,index,'\0');
        std::__cxx11::string::~string((string *)&header_1);
        std::__cxx11::string::~string((string *)&partition);
        Bstrlib::CBString::~CBString((CBString *)&local_128);
        if (((*(uint *)((UINT8 *)_Var21._M_p + 0xc) & 0x1ffffff) != 0) &&
           (*(int *)((UINT8 *)_Var21._M_p + 0x10) != 0)) {
          partition.type = 'a';
          partition.ptEntry.EntryName._0_8_ = *(undefined8 *)_Var21._M_p;
          uVar4 = *(undefined8 *)((UINT8 *)_Var21._M_p + 8);
          partition.ptEntry.EntryName._8_2_ = SUB82(uVar4,0);
          partition.ptEntry.EntryName._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
          partition.ptEntry.Offset = SUB84((ulong)uVar4 >> 0x20,0);
          uVar4 = *(undefined8 *)((UINT8 *)_Var21._M_p + 0x10);
          partition.ptEntry.Length._0_1_ = (undefined1)uVar4;
          partition.ptEntry.Length._1_1_ = (undefined1)((ulong)uVar4 >> 8);
          partition.ptEntry.Length._2_2_ = (undefined2)((ulong)uVar4 >> 0x10);
          partition.ptEntry.Reserved = (UINT32)((ulong)uVar4 >> 0x20);
          partition.index.m = (TreeModel *)CONCAT71(entryIndex.m._1_7_,entryIndex.m._0_1_);
          partition.index.r = entryIndex.r;
          partition.index.c = entryIndex.c;
          partition.index.i = entryIndex.i;
          partition.hasMetaData = false;
          std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::push_back
                    (&partitions,&partition);
        }
        std::__cxx11::string::~string((string *)&entry);
        _Var21._M_p = _Var21._M_p + 0x18;
        offset = offset + 0x18;
      }
      if (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        UByteArray::mid((UByteArray *)&partition,region,pos,-1);
        Bstrlib::CBString::CBString((CBString *)&entry,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&entry);
        Bstrlib::CBString::~CBString((CBString *)&entry);
        usprintf((CBString *)&entry,"Full size: %Xh (%u)",
                 (ulong)CONCAT22(partition.ptEntry.EntryName._10_2_,
                                 partition.ptEntry.EntryName._8_2_));
        Bstrlib::CBString::operator=(&info,(CBString *)&entry);
        Bstrlib::CBString::~CBString((CBString *)&entry);
        pTVar3 = this->model;
        UVar8 = getPaddingType((UByteArray *)&partition);
        Bstrlib::CBString::CBString((CBString *)&entryIndex);
        entry.d._M_dataplus._M_p = (pointer)&entry.d.field_2;
        entry.d._M_string_length = 0;
        entry.d.field_2._M_local_buf[0] = '\0';
        header_1.d._M_dataplus._M_p = (pointer)&header_1.d.field_2;
        header_1.d._M_string_length = 0;
        header_1.d.field_2._M_local_buf[0] = '\0';
        TreeModel::addItem((UModelIndex *)&local_128,pTVar3,pos + localOffset,'@',UVar8,&name,
                           (CBString *)&entryIndex,&info,&entry,(UByteArray *)&partition,&header_1,
                           Fixed,parent,'\0');
        std::__cxx11::string::~string((string *)&header_1);
        std::__cxx11::string::~string((string *)&entry);
        Bstrlib::CBString::~CBString((CBString *)&entryIndex);
        std::__cxx11::string::~string((string *)&partition);
LAB_00132fe4:
        UVar15 = 0;
      }
      else {
        std::
        __sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
        for (uVar19 = 1;
            uVar19 < (ulong)(((long)partitions.
                                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x38);
            uVar19 = (ulong)((int)uVar19 + 1)) {
          usprintf((CBString *)&partition,"%.12s",
                   partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar19);
          Bstrlib::CBString::operator=(&name,(CBString *)&partition);
          Bstrlib::CBString::~CBString((CBString *)&partition);
          bVar6 = Bstrlib::CBString::endsWith(&name,".met");
          if (!bVar6) break;
          UByteArray::mid((UByteArray *)&partition,region,
                          (uint)partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar19].ptEntry.Offset &
                          0x1ffffff,
                          partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].ptEntry.Length);
          uVar9 = 0xffffffff;
          for (uVar11 = 0;
              uVar11 < CONCAT22(partition.ptEntry.EntryName._10_2_,partition.ptEntry.EntryName._8_2_
                               ); uVar11 = uVar11 + uVar12) {
            uVar18 = (ulong)uVar11;
            uVar12 = *(uint *)(partition.ptEntry.EntryName._0_8_ + 4 + uVar18);
            if (CONCAT22(partition.ptEntry.EntryName._10_2_,partition.ptEntry.EntryName._8_2_) -
                uVar11 < uVar12) break;
            if (*(int *)(partition.ptEntry.EntryName._0_8_ + uVar18) == 10) {
              uVar9 = *(uint *)(partition.ptEntry.EntryName._0_8_ + 0x10 + uVar18);
            }
          }
          Bstrlib::CBString::chop(&name,4);
          bVar6 = false;
          uVar18 = 1;
          do {
            if ((ulong)(((long)partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar18) break;
            usprintf((CBString *)&entry,"%.12s",
                     partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar18);
            bVar7 = Bstrlib::CBString::operator==(&name,(CBString *)&entry);
            if (bVar7) {
              pCVar16 = partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar18;
              if ((partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar18].ptEntry.Offset.field_0x3 & 2) ==
                  0) {
                if ((uVar9 != 0xffffffff) && (uVar11 = (pCVar16->ptEntry).Length, uVar11 != uVar9))
                {
                  usprintf((CBString *)&header_1,
                           "%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)"
                           ,"parseCpdRegion",(ulong)uVar11,(ulong)uVar9);
                  msg(this,(CBString *)&header_1,
                      &partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18].index);
                  Bstrlib::CBString::~CBString((CBString *)&header_1);
                  pCVar16 = partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar18;
                  goto LAB_0013212a;
                }
              }
              else {
LAB_0013212a:
                (pCVar16->ptEntry).Length = uVar9;
              }
              partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18].hasMetaData = true;
              bVar6 = true;
            }
            else {
              uVar18 = (ulong)((int)uVar18 + 1);
            }
            Bstrlib::CBString::~CBString((CBString *)&entry);
          } while (!bVar7);
          if (!bVar6) {
            usprintf((CBString *)&entry,"%s: no code partition","parseCpdRegion");
            msg(this,(CBString *)&entry,
                &partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar19].index);
            Bstrlib::CBString::~CBString((CBString *)&entry);
          }
          std::__cxx11::string::~string((string *)&partition);
        }
        local_1d0 = (anon_struct_4_3_7b74da23_for_Offset)(pos & 0x1fffffc);
        while (partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_start !=
               partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_finish) {
          std::
          __sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
          partition.ptEntry.Length._0_1_ = 0;
          partition.ptEntry.Length._1_1_ = 0;
          partition.ptEntry.Length._2_2_ = 0;
          partition.ptEntry.Reserved = 0;
          partition.type = '\0';
          partition.hasMetaData = false;
          partition._26_6_ = 0;
          partition.ptEntry.EntryName[0] = '\0';
          partition.ptEntry.EntryName[1] = '\0';
          partition.ptEntry.EntryName[2] = '\0';
          partition.ptEntry.EntryName[3] = '\0';
          partition.ptEntry.EntryName[4] = '\0';
          partition.ptEntry.EntryName[5] = '\0';
          partition.ptEntry.EntryName[6] = '\0';
          partition.ptEntry.EntryName[7] = '\0';
          partition.ptEntry.EntryName[8] = '\0';
          partition.ptEntry.EntryName[9] = '\0';
          partition.ptEntry.EntryName[10] = '\0';
          partition.ptEntry.EntryName[0xb] = '\0';
          partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
          partition.index.r = -1;
          partition.index.c = -1;
          partition.index.i = 0;
          partition.index.m = (TreeModel *)0x0;
          uVar9 = (uint)((partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset & 0x1ffffff;
          if (uVar9 < pos) {
            usprintf((CBString *)&entry,
                     "%s: CPD partition has intersection with CPD partition table, skipped",
                     "parseCpdRegion");
            msg(this,(CBString *)&entry,
                &(partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->index);
            Bstrlib::CBString::~CBString((CBString *)&entry);
            pCVar16 = partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            if (pCVar16 !=
                partitions.
                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              __n = (long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16;
              __dest = partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_00132511:
              memmove(__dest,pCVar16,__n);
            }
LAB_0013251b:
            partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            if (pos < uVar9) {
              partition.ptEntry.Offset = local_1d0;
              iVar10 = ((uint)((partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset &
                       0x1ffffff) - (int)local_1d0;
              partition.ptEntry.Length._0_1_ = (undefined1)iVar10;
              partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar10 >> 8);
              partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar10 >> 0x10);
              partition.type = '@';
              std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::insert
                        (&partitions,
                         (const_iterator)
                         partitions.
                         super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_start,&partition);
            }
            lVar20 = 0;
            uVar19 = 1;
            while( true ) {
              if ((ulong)(((long)partitions.
                                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar19) {
                aVar1 = partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
                uVar9 = partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Length;
                iVar10 = (int)(region->d)._M_string_length;
                if ((ulong)((uint)aVar1 & 0x1ffffff) + (ulong)uVar9 < (ulong)(long)iVar10) {
                  uVar9 = uVar9 + (int)aVar1 & 0x1ffffff;
                  partition.ptEntry.Offset =
                       (anon_struct_4_3_7b74da23_for_Offset)
                       ((uint)partition.ptEntry.Offset & 0xfe000000 | uVar9);
                  iVar10 = iVar10 - uVar9;
                  partition.ptEntry.Length._0_1_ = (undefined1)iVar10;
                  partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar10 >> 8);
                  partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar10 >> 0x10);
                  partition.type = '@';
                  std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::push_back
                            (&partitions,&partition);
                }
                lVar20 = 0;
                uVar19 = 0;
                goto LAB_001325e9;
              }
              uVar14 = (*(uint *)(((partitions.
                                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                                 lVar20 + 0xc) & 0x1ffffff) +
                       *(int *)(((partitions.
                                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                               lVar20 + 0x10);
              uVar9 = *(uint *)(partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                               lVar20 + 0xc);
              uVar11 = *(uint *)(partitions.
                                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                lVar20 + 0x10);
              uVar12 = uVar9 & 0x1ffffff;
              uVar17 = (uint)(region->d)._M_string_length;
              if ((ulong)(long)(int)uVar17 < (ulong)uVar12 + (ulong)uVar11) {
                if (uVar17 <= uVar12) {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition is located outside of the opened image, skipped",
                           "parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar20 + 8));
                  goto LAB_001324e0;
                }
                if (((uVar9 >> 0x19 & 1) == 0) ||
                   (*(UINT8 *)((long)(&partitions.
                                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                              lVar20 + 1) != '\0')) {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition can\'t fit into its region, truncated",
                           "parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar20 + 8));
                }
                else {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition is compressed but doesn\'t have metadata and can\'t fit into its region, length adjusted"
                           ,"parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar20 + 8));
                }
                Bstrlib::CBString::~CBString((CBString *)&entry);
                uVar12 = *(uint *)(partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                  lVar20 + 0xc) & 0x1ffffff;
                uVar11 = (int)(region->d)._M_string_length - uVar12;
                *(uint *)(partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                         lVar20 + 0x10) = uVar11;
              }
              if (uVar12 < uVar14) break;
              if (uVar14 < uVar12) {
                partition.ptEntry.Offset =
                     (anon_struct_4_3_7b74da23_for_Offset)
                     ((uint)partition.ptEntry.Offset & 0xfe000000 | uVar14);
                iVar10 = (*(uint *)(partitions.
                                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                   lVar20 + 0xc) & 0x1ffffff) - uVar14;
                partition.ptEntry.Length._0_1_ = (undefined1)iVar10;
                partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar10 >> 8);
                partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar10 >> 0x10);
                partition.type = '@';
                std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::insert
                          (&partitions,
                           (CPD_PARTITION_INFO_ *)
                           (partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName + lVar20)
                           ,&partition);
              }
              uVar19 = uVar19 + 1;
              lVar20 = lVar20 + 0x38;
            }
            if ((*(UINT8 *)((long)(&(partitions.
                                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->ptEntry + 1) +
                           lVar20 + 1) != '\0') ||
               ((((partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName[lVar20 + 0xf] & 2)
                == 0)) {
              if (uVar14 < uVar11 + uVar12) {
                usprintf((CBString *)&entry,
                         "%s: CPD partition intersects with previous one, skipped","parseCpdRegion")
                ;
                msg(this,(CBString *)&entry,
                    (UModelIndex *)
                    ((long)(&partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) + lVar20 + 8)
                   );
              }
              else {
                usprintf((CBString *)&entry,
                         "%s: CPD partition is located inside another CPD partition, skipped",
                         "parseCpdRegion");
                msg(this,(CBString *)&entry,
                    (UModelIndex *)
                    ((long)(&partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) + lVar20 + 8)
                   );
              }
LAB_001324e0:
              Bstrlib::CBString::~CBString((CBString *)&entry);
              pCVar16 = (pointer)(partitions.
                                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].ptEntry.EntryName +
                                 lVar20);
              if (pCVar16 !=
                  partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                __dest = (pointer)(partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                  lVar20);
                __n = (long)partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                      (-lVar20 -
                      (long)partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + -0x70;
                goto LAB_00132511;
              }
              goto LAB_0013251b;
            }
            usprintf((CBString *)&entry,
                     "%s: CPD partition is compressed but doesn\'t have metadata, length adjusted",
                     "parseCpdRegion");
            msg(this,(CBString *)&entry,
                (UModelIndex *)
                ((long)(&(partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry + 1) + lVar20 + 8));
            Bstrlib::CBString::~CBString((CBString *)&entry);
            *(uint *)(((partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                     lVar20 + 0x10) =
                 (*(uint *)(partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                           lVar20 + 0xc) & 0x1ffffff) -
                 (*(uint *)(((partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                           lVar20 + 0xc) & 0x1ffffff);
          }
        }
LAB_00133023:
        UVar15 = 0xfd;
      }
      std::_Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::~_Vector_base
                (&partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>);
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString(&name);
      std::__cxx11::string::~string((string *)&body);
      std::__cxx11::string::~string((string *)&header);
      return UVar15;
    }
    usprintf((CBString *)&partition,"%s: CPD too small to fit the whole partition table",
             "parseCpdRegion");
    msg(this,(CBString *)&partition,parent);
  }
LAB_00131b8a:
  Bstrlib::CBString::~CBString((CBString *)&partition);
  return 0xfd;
LAB_001325e9:
  if ((ulong)(((long)partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar19) goto LAB_00132fe4;
  if (*(UINT8 *)((long)(&(partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry + 1) + lVar20) == '@')
  {
    UByteArray::mid(&entry,region,
                    *(uint *)(((partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                             lVar20 + 0xc) & 0x1ffffff,
                    *(int32_t *)
                     (((partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                     lVar20 + 0x10));
    Bstrlib::CBString::CBString((CBString *)&header_1,"Padding");
    Bstrlib::CBString::operator=(&name,(CBString *)&header_1);
    Bstrlib::CBString::~CBString((CBString *)&header_1);
    usprintf((CBString *)&header_1,"Full size: %Xh (%u)",entry.d._M_string_length & 0xffffffff);
    Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
    Bstrlib::CBString::~CBString((CBString *)&header_1);
    pTVar3 = this->model;
    uVar9 = *(uint *)(((partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                     lVar20 + 0xc);
    UVar8 = getPaddingType(&entry);
    Bstrlib::CBString::CBString((CBString *)&local_128);
    header_1.d._M_dataplus._M_p = (pointer)&header_1.d.field_2;
    header_1.d._M_string_length = 0;
    header_1.d.field_2._M_local_buf[0] = '\0';
    entryIndex._0_8_ = &entryIndex.m;
    entryIndex.i = 0;
    entryIndex.m._0_1_ = 0;
    TreeModel::addItem(&partitionIndex,pTVar3,(uVar9 & 0x1ffffff) + localOffset,'@',UVar8,&name,
                       (CBString *)&local_128,&info,&header_1,&entry,(UByteArray *)&entryIndex,Fixed
                       ,parent,'\0');
    std::__cxx11::string::~string((string *)&entryIndex);
    std::__cxx11::string::~string((string *)&header_1);
    Bstrlib::CBString::~CBString((CBString *)&local_128);
  }
  else {
    if (*(UINT8 *)((long)(&(partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptEntry + 1) + lVar20) !=
        'a') {
      usprintf((CBString *)&entry,"%s: CPD partition of unknown type found","parseCpdRegion");
      msg(this,(CBString *)&entry,parent);
      Bstrlib::CBString::~CBString((CBString *)&entry);
      goto LAB_00133023;
    }
    UByteArray::mid(&entry,region,
                    *(uint *)(((partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                             lVar20 + 0xc) & 0x1ffffff,
                    *(int32_t *)
                     (((partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                     lVar20 + 0x10));
    usprintf((CBString *)&header_1,"%.12s",
             ((partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_start)->ptEntry).EntryName + lVar20);
    Bstrlib::CBString::operator=(&name,(CBString *)&header_1);
    Bstrlib::CBString::~CBString((CBString *)&header_1);
    bVar6 = Bstrlib::CBString::endsWith(&name,".man");
    _Var21 = entry.d._M_dataplus;
    if (bVar6) {
      if ((((((partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_start)->ptEntry).EntryName[lVar20 + 0xf] & 2) != 0) ||
          (*(uint *)(((partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                    lVar20 + 0x10) < 0x80)) ||
         (*(int *)(entry.d._M_dataplus._M_p + 0x1c) != 0x324e4d24)) goto LAB_00132e83;
      UByteArray::left(&header_1,&entry,*(int *)(entry.d._M_dataplus._M_p + 4) << 2);
      UByteArray::mid((UByteArray *)&entryIndex,&entry,*(int *)(_Var21._M_p + 4) << 2,-1);
      local_78 = (ulong)*(uint *)(_Var21._M_p + 0x10);
      local_80 = (ulong)*(uint *)(_Var21._M_p + 0x14);
      local_88 = (ulong)*(ushort *)(_Var21._M_p + 0x24);
      local_90 = (ulong)*(ushort *)(_Var21._M_p + 0x26);
      local_98 = (ulong)*(ushort *)(_Var21._M_p + 0x28);
      local_a0 = (ulong)*(ushort *)(_Var21._M_p + 0x2a);
      usprintf((CBString *)&local_128,
               "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\nDate: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)"
               ,entry.d._M_string_length & 0xffffffff,entry.d._M_string_length & 0xffffffff,
               header_1.d._M_string_length & 0xffffffff,header_1.d._M_string_length & 0xffffffff,
               entryIndex.i & 0xffffffff,entryIndex.i & 0xffffffff,(ulong)*(uint *)_Var21._M_p,
               (ulong)(uint)(*(int *)(_Var21._M_p + 4) << 2),
               (ulong)(uint)(*(int *)(_Var21._M_p + 4) << 2),(ulong)*(uint *)(_Var21._M_p + 8),
               (ulong)*(uint *)(_Var21._M_p + 0xc),local_78,local_80,
               (ulong)(uint)(*(int *)(_Var21._M_p + 0x18) << 2),
               (ulong)(uint)(*(int *)(_Var21._M_p + 0x18) << 2),local_88,local_90,local_98,local_a0,
               (ulong)*(uint *)(_Var21._M_p + 0x2c),(ulong)(uint)(*(int *)(_Var21._M_p + 0x78) << 2)
               ,(ulong)(uint)(*(int *)(_Var21._M_p + 0x78) << 2),
               (ulong)(uint)(*(int *)(_Var21._M_p + 0x7c) << 2),
               (ulong)(uint)(*(int *)(_Var21._M_p + 0x7c) << 2));
      Bstrlib::CBString::operator=(&info,(CBString *)&local_128);
      Bstrlib::CBString::~CBString((CBString *)&local_128);
      pTVar3 = this->model;
      uVar9 = *(uint *)(((partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                       lVar20 + 0xc);
      Bstrlib::CBString::CBString(&local_b8);
      local_128 = (_func_int **)local_118;
      local_120 = 0;
      local_118[0] = 0;
      TreeModel::addItem(&partitionIndex,pTVar3,(uVar9 & 0x1ffffff) + localOffset,'a',0xe6,&name,
                         &local_b8,&info,&header_1,(UByteArray *)&entryIndex,
                         (UByteArray *)&local_128,Fixed,parent,'\0');
      std::__cxx11::string::~string((string *)&local_128);
      Bstrlib::CBString::~CBString(&local_b8);
      parseCpdExtensionsArea(this,&partitionIndex,(UINT32)header_1.d._M_string_length);
      std::__cxx11::string::~string((string *)&entryIndex);
    }
    else {
      bVar6 = Bstrlib::CBString::endsWith(&name,".met");
      if (bVar6) {
        usprintf((CBString *)&entryIndex,"Full size: %Xh (%u)\nHuffman compressed: ",
                 entry.d._M_string_length & 0xffffffff);
        pcVar13 = "Yes";
        if ((*(uint *)(((partitions.
                         super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                      lVar20 + 0xc) >> 0x19 & 1) == 0) {
          pcVar13 = "No";
        }
        Bstrlib::CBString::operator+((CBString *)&header_1,(CBString *)&entryIndex,pcVar13);
        Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
        Bstrlib::CBString::~CBString((CBString *)&header_1);
        Bstrlib::CBString::~CBString((CBString *)&entryIndex);
        UByteArray::UByteArray(&header_1,0x20,'\0');
        sVar5 = entry.d._M_string_length;
        _Var21 = entry.d._M_dataplus;
        pcVar13 = UByteArray::data(&header_1);
        sha256(_Var21._M_p,(long)(int)sVar5,pcVar13);
        Bstrlib::CBString::CBString((CBString *)&partitionIndex,"\nMetadata hash: ");
        UByteArray::toHex((UByteArray *)&entryIndex,&header_1);
        Bstrlib::CBString::CBString(&local_b8,(char *)entryIndex._0_8_);
        Bstrlib::CBString::operator+((CBString *)&local_128,(CBString *)&partitionIndex,&local_b8);
        Bstrlib::CBString::operator+=(&info,(CBString *)&local_128);
        Bstrlib::CBString::~CBString((CBString *)&local_128);
        Bstrlib::CBString::~CBString(&local_b8);
        std::__cxx11::string::~string((string *)&entryIndex);
        Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
        pTVar3 = this->model;
        uVar9 = *(uint *)(((partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                         lVar20 + 0xc);
        Bstrlib::CBString::CBString(&local_b8);
        entryIndex._0_8_ = &entryIndex.m;
        entryIndex.i = 0;
        entryIndex.m._0_1_ = 0;
        local_128 = (_func_int **)local_118;
        local_120 = 0;
        local_118[0] = 0;
        TreeModel::addItem(&partitionIndex,pTVar3,(uVar9 & 0x1ffffff) + localOffset,'a',0xe7,&name,
                           &local_b8,&info,(UByteArray *)&entryIndex,&entry,(UByteArray *)&local_128
                           ,Fixed,parent,'\0');
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&entryIndex);
        Bstrlib::CBString::~CBString(&local_b8);
        parseCpdExtensionsArea(this,&partitionIndex,0);
      }
      else {
        usprintf((CBString *)&entryIndex,"Full size: %Xh (%u)\nHuffman compressed: ",
                 entry.d._M_string_length & 0xffffffff);
        pcVar13 = "Yes";
        if ((*(uint *)(((partitions.
                         super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                      lVar20 + 0xc) >> 0x19 & 1) == 0) {
          pcVar13 = "No";
        }
        Bstrlib::CBString::operator+((CBString *)&header_1,(CBString *)&entryIndex,pcVar13);
        Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
        Bstrlib::CBString::~CBString((CBString *)&header_1);
        Bstrlib::CBString::~CBString((CBString *)&entryIndex);
        UByteArray::UByteArray(&header_1,0x20,'\0');
        sVar5 = entry.d._M_string_length;
        _Var21 = entry.d._M_dataplus;
        pcVar13 = UByteArray::data(&header_1);
        sha256(_Var21._M_p,(long)(int)sVar5,pcVar13);
        Bstrlib::CBString::CBString((CBString *)&partitionIndex,"\nHash: ");
        UByteArray::toHex((UByteArray *)&entryIndex,&header_1);
        Bstrlib::CBString::CBString(&local_b8,(char *)entryIndex._0_8_);
        Bstrlib::CBString::operator+((CBString *)&local_128,(CBString *)&partitionIndex,&local_b8);
        Bstrlib::CBString::operator+=(&info,(CBString *)&local_128);
        Bstrlib::CBString::~CBString((CBString *)&local_128);
        Bstrlib::CBString::~CBString(&local_b8);
        std::__cxx11::string::~string((string *)&entryIndex);
        Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
        pTVar3 = this->model;
        uVar9 = *(uint *)(((partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                         lVar20 + 0xc);
        Bstrlib::CBString::CBString(&local_b8);
        entryIndex._0_8_ = &entryIndex.m;
        entryIndex.i = 0;
        entryIndex.m._0_1_ = 0;
        local_128 = (_func_int **)local_118;
        local_120 = 0;
        local_118[0] = 0;
        TreeModel::addItem(&partitionIndex,pTVar3,(uVar9 & 0x1ffffff) + localOffset,'a',0xe9,&name,
                           &local_b8,&info,(UByteArray *)&entryIndex,&entry,(UByteArray *)&local_128
                           ,Fixed,parent,'\0');
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&entryIndex);
        Bstrlib::CBString::~CBString(&local_b8);
        parseRawArea(this,&partitionIndex);
      }
    }
    std::__cxx11::string::~string((string *)&header_1);
  }
LAB_00132e83:
  std::__cxx11::string::~string((string *)&entry);
  uVar19 = uVar19 + 1;
  lVar20 = lVar20 + 0x38;
  goto LAB_001325e9;
}

Assistant:

USTATUS FfsParser::parseCpdRegion(const UByteArray & region, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Check directory size
    if ((UINT32)region.size() < sizeof(CPD_REV1_HEADER)) {
        msg(usprintf("%s: CPD too small to fit rev1 partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const CPD_REV1_HEADER* cpdHeader = (const CPD_REV1_HEADER*)region.constData();
    
    // Check header version to be known
    UINT32 ptHeaderSize = 0;
    if (cpdHeader->HeaderVersion == 2) {
        if ((UINT32)region.size() < sizeof(CPD_REV2_HEADER)) {
            msg(usprintf("%s: CPD too small to fit rev2 partition table header", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
        
        ptHeaderSize = sizeof(CPD_REV2_HEADER);
    }
    else if (cpdHeader->HeaderVersion == 1) {
        ptHeaderSize = sizeof(CPD_REV1_HEADER);
    }
    
    // Check directory size again
    UINT32 ptBodySize = cpdHeader->NumEntries * sizeof(CPD_ENTRY);
    UINT32 ptSize = ptHeaderSize + ptBodySize;
    if ((UINT32)region.size() < ptSize) {
        msg(usprintf("%s: CPD too small to fit the whole partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(ptHeaderSize);
    UByteArray body = region.mid(ptHeaderSize, ptBodySize);
    UString name = usprintf("CPD partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\n"
                            "Header version: %u\nEntry version: %u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            cpdHeader->NumEntries,
                            cpdHeader->HeaderVersion,
                            cpdHeader->EntryVersion);
    
    // Add tree item
    index = model->addItem(localOffset, Types::CpdStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Add partition table entries
    std::vector<CPD_PARTITION_INFO> partitions;
    UINT32 offset = ptHeaderSize;
    const CPD_ENTRY* firstCpdEntry = (const CPD_ENTRY*)(body.constData());
    for (UINT32 i = 0; i < cpdHeader->NumEntries; i++) {
        // Populate entry header
        const CPD_ENTRY* cpdEntry = firstCpdEntry + i;
        UByteArray entry((const char*)cpdEntry, sizeof(CPD_ENTRY));
        
        // Get info
        name = usprintf("%.12s", cpdEntry->EntryName);
        info = usprintf("Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
                        (UINT32)entry.size(), (UINT32)entry.size(),
                        cpdEntry->Offset.Offset,
                        cpdEntry->Length)
        + (cpdEntry->Offset.HuffmanCompressed ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(offset, Types::CpdEntry, 0, name, UString(), info, UByteArray(), entry, UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(CPD_ENTRY);
        
        if (cpdEntry->Offset.Offset != 0 && cpdEntry->Length != 0) {
            // Add to partitions vector
            CPD_PARTITION_INFO partition;
            partition.type = Types::CpdPartition;
            partition.ptEntry = *cpdEntry;
            partition.index = entryIndex;
            partition.hasMetaData = false;
            partitions.push_back(partition);
        }
    }
    
    // Add padding if there's no partions to add
    if (partitions.size() == 0) {
        UByteArray partition = region.mid(ptSize);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)partition.size(), (UINT32)partition.size());
        
        // Add tree item
        model->addItem(localOffset + ptSize, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        
        return U_SUCCESS;
    }
    
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Because lenghts for all Huffmann-compressed partitions mean nothing at all, we need to split all partitions into 2 classes:
    // 1. CPD manifest
    // 2. Metadata entries
    UINT32 i = 1; // manifest is index 0, .met partitions start at index 1
    while (i < partitions.size()) {
        name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
        
        // Check if the current entry is metadata entry
        if (!name.endsWith(".met")) {
            // No need to parse further, all metadata partitions are parsed
            break;
        }
        
        // Parse into data block, find Module Attributes extension, and get compressed size from there
        UINT32 offset = 0;
        UINT32 length = 0xFFFFFFFF; // Special guardian value
        UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
        while (offset < (UINT32)partition.size()) {
            const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (partition.constData() + offset);
            if (extHeader->Length <= ((UINT32)partition.size() - offset)) {
                if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                    const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)(partition.constData() + offset);
                    length = attrHeader->CompressedSize;
                }
                offset += extHeader->Length;
            }
            else break;
        }
        
        // Search down for corresponding code partition
        // Construct its name by removing the .met suffix
        name.chop(4);
        
        // Search
        bool found = false;
        UINT32 j = 1;
        while (j < partitions.size()) {
            UString namej = usprintf("%.12s", partitions[j].ptEntry.EntryName);
            
            if (name == namej) {
                found = true;
                // Found it, update its Length if needed
                if (partitions[j].ptEntry.Offset.HuffmanCompressed) {
                    partitions[j].ptEntry.Length = length;
                }
                else if (length != 0xFFFFFFFF && partitions[j].ptEntry.Length != length) {
                    msg(usprintf("%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)", __FUNCTION__,
                                 partitions[j].ptEntry.Length, length), partitions[j].index);
                    partitions[j].ptEntry.Length = length; // Believe metadata
                }
                partitions[j].hasMetaData = true;
                // No need to search further
                break;
            }
            // Check the next partition
            j++;
        }
        if (!found) {
            msg(usprintf("%s: no code partition", __FUNCTION__), partitions[i].index);
        }
        
        // Check the next partition
        i++;
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    CPD_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset.Offset < ptSize) {
        msg(usprintf("%s: CPD partition has intersection with CPD partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset.Offset > ptSize) {
        padding.ptEntry.Offset.Offset = ptSize;
        padding.ptEntry.Length = partitions.front().ptEntry.Offset.Offset - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset.Offset + partitions[i - 1].ptEntry.Length;
        
        // Check that current region is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset.Offset + (UINT64)partitions[i].ptEntry.Length > (UINT64)region.size()) {
            if ((UINT64)partitions[i].ptEntry.Offset.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: CPD partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                if (!partitions[i].hasMetaData && partitions[i].ptEntry.Offset.HuffmanCompressed) {
                    msg(usprintf("%s: CPD partition is compressed but doesn't have metadata and can't fit into its region, length adjusted", __FUNCTION__),
                        partitions[i].index);
                }
                else {
                    msg(usprintf("%s: CPD partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                }
                partitions[i].ptEntry.Length = (UINT32)region.size() - (UINT32)partitions[i].ptEntry.Offset.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset.Offset < previousPartitionEnd) {
            // Check if previous partition was compressed but did not have metadata
            if (!partitions[i - 1].hasMetaData && partitions[i - 1].ptEntry.Offset.HuffmanCompressed) {
                msg(usprintf("%s: CPD partition is compressed but doesn't have metadata, length adjusted", __FUNCTION__),
                    partitions[i - 1].index);
                partitions[i - 1].ptEntry.Length = (UINT32)partitions[i].ptEntry.Offset.Offset - (UINT32)partitions[i - 1].ptEntry.Offset.Offset;
                goto make_partition_table_consistent;
            }
            
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset.Offset + partitions[i].ptEntry.Length <= previousPartitionEnd) {
                msg(usprintf("%s: CPD partition is located inside another CPD partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: CPD partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset.Offset = previousPartitionEnd;
            padding.ptEntry.Length = partitions[i].ptEntry.Offset.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<CPD_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    // Check for padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset.Offset + (UINT64)partitions.back().ptEntry.Length < (UINT64)region.size()) {
        padding.ptEntry.Offset.Offset = partitions.back().ptEntry.Offset.Offset + partitions.back().ptEntry.Length;
        padding.ptEntry.Length = (UINT32)region.size() - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::CpdPartition) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
            
            // It's a manifest
            if (name.endsWith(".man")) {
                if (!partitions[i].ptEntry.Offset.HuffmanCompressed
                    && partitions[i].ptEntry.Length >= sizeof(CPD_MANIFEST_HEADER)) {
                    const CPD_MANIFEST_HEADER* manifestHeader = (const CPD_MANIFEST_HEADER*) partition.constData();
                    if (manifestHeader->HeaderId == ME_MANIFEST_HEADER_ID) {
                        UByteArray header = partition.left(manifestHeader->HeaderLength * sizeof(UINT32));
                        UByteArray body = partition.mid(manifestHeader->HeaderLength * sizeof(UINT32));
                        
                        info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)"
                                        "\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\n"
                                        "Date: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)",
                                        (UINT32)partition.size(), (UINT32)partition.size(),
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        manifestHeader->HeaderType,
                                        manifestHeader->HeaderLength * (UINT32)sizeof(UINT32), manifestHeader->HeaderLength * (UINT32)sizeof(UINT32),
                                        manifestHeader->HeaderVersion,
                                        manifestHeader->Flags,
                                        manifestHeader->Vendor,
                                        manifestHeader->Date,
                                        manifestHeader->Size * (UINT32)sizeof(UINT32), manifestHeader->Size * (UINT32)sizeof(UINT32),
                                        manifestHeader->VersionMajor, manifestHeader->VersionMinor, manifestHeader->VersionBugfix, manifestHeader->VersionBuild,
                                        manifestHeader->SecurityVersion,
                                        manifestHeader->ModulusSize * (UINT32)sizeof(UINT32), manifestHeader->ModulusSize * (UINT32)sizeof(UINT32),
                                        manifestHeader->ExponentSize * (UINT32)sizeof(UINT32), manifestHeader->ExponentSize * (UINT32)sizeof(UINT32));
                        
                        // Add tree item
                        UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::ManifestCpdPartition, name, UString(), info, header, body, UByteArray(), Fixed, parent);
                        
                        // Parse data as extensions area
                        // Add the header size as a local offset
                        // Since the body starts after the header length
                        parseCpdExtensionsArea(partitionIndex, (UINT32)header.size());
                    }
                }
            }
            // It's a metadata
            else if (name.endsWith(".met")) {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the metadata and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nMetadata hash: ") + UString(hash.toHex().constData());
                
                // Add three item
                UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition,  Subtypes::MetadataCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                
                // Parse data as extensions area
                parseCpdExtensionsArea(partitionIndex, 0);
            }
            // It's a code
            else {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the code and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nHash: ") + UString(hash.toHex().constData());
                
                UModelIndex codeIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::CodeCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                (void)parseRawArea(codeIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)partition.size(), (UINT32)partition.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        }
        else {
            msg(usprintf("%s: CPD partition of unknown type found", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
    }
    
    return U_SUCCESS;
}